

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompareDump.cpp
# Opt level: O2

void CompareOnTheFlyMaterial(comparer_context *comp)

{
  scoped_chunk chunk;
  sliced_chunk_iterator it;
  sliced_chunk_reader reader;
  scoped_chunk local_48;
  undefined1 local_40 [40];
  sliced_chunk_reader local_18;
  
  local_48.ctx = comp;
  comparer_context::push_elem(comp,"aiMaterial");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_40,"aiMaterial::mNumProperties",(allocator<char> *)&local_18);
  comparer_context::cmp<unsigned_int>(comp,(string *)local_40);
  std::__cxx11::string::~string((string *)local_40);
  local_18.ctx = comp;
  sliced_chunk_reader::begin((sliced_chunk_iterator *)local_40,&local_18);
  while (local_40[0x10] != '\x01') {
    if (local_40._8_4_ == 0x123e) {
      CompareOnTheFlyMaterialProperty(comp);
    }
    sliced_chunk_iterator::operator++((sliced_chunk_iterator *)local_40);
  }
  sliced_chunk_iterator::~sliced_chunk_iterator((sliced_chunk_iterator *)local_40);
  scoped_chunk::~scoped_chunk(&local_48);
  return;
}

Assistant:

void CompareOnTheFlyMaterial(comparer_context& comp)    {
    scoped_chunk chunk(comp,"aiMaterial");

    comp.cmp<uint32_t>("aiMaterial::mNumProperties");
    sliced_chunk_reader reader(comp);
    for(sliced_chunk_iterator it = reader.begin(); !it.is_end(); ++it) {
        if ((*it).first == ASSBIN_CHUNK_AIMATERIALPROPERTY) {
            CompareOnTheFlyMaterialProperty(comp);
        }
    }
}